

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_determine_sc_tools_with_encoding(AV1_COMP *cpi,int q_orig)

{
  AV1_COMMON *cm;
  segmentation *dst;
  _Bool _Var1;
  _Bool _Var2;
  PARTITION_SEARCH_TYPE PVar3;
  BLOCK_SIZE BVar4;
  int iVar5;
  RefCntBuffer *pRVar6;
  int iVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  int iVar9;
  uint uVar10;
  _Bool _Var11;
  int q;
  PSNR_STATS *psnr_00;
  int pass;
  long lVar12;
  double dVar13;
  PSNR_STATS psnr [3];
  
  if ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) {
    return;
  }
  if (((((cpi->oxcf).kf_cfg.fwd_kf_enabled == false) && (cpi->superres_mode == AOM_SUPERRES_NONE))
      && ((cpi->oxcf).mode != '\x01')) &&
     ((cpi->use_screen_content_tools == 0 && ((cpi->common).current_frame.frame_type == '\0')))) {
    cm = &cpi->common;
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      q = 0xf4;
      if (0xf4 < q_orig) {
        q = q_orig;
      }
      if ((cpi->oxcf).rc_cfg.worst_allowed_q == 0) {
        q = q_orig;
      }
    }
    else {
      q = 0xf4;
      if (0xf4 < q_orig) {
        q = q_orig;
      }
    }
    _Var1 = (cpi->common).features.allow_screen_content_tools;
    _Var2 = (cpi->common).features.allow_intrabc;
    iVar5 = cpi->is_screen_content_type;
    PVar3 = (cpi->sf).part_sf.partition_search_type;
    BVar4 = (cpi->sf).part_sf.fixed_partition_size;
    pYVar8 = av1_realloc_and_scale_if_required
                       (cm,cpi->unscaled_source,&cpi->scaled_source,
                        (cpi->common).features.interp_filter,0,false,false,
                        (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
    cpi->source = pYVar8;
    if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
      pYVar8 = av1_realloc_and_scale_if_required
                         (cm,cpi->unscaled_last_source,&cpi->scaled_last_source,
                          (cpi->common).features.interp_filter,0,false,false,
                          (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->last_source = pYVar8;
    }
    av1_setup_frame(cpi);
    dst = &(cpi->common).seg;
    if ((cpi->common).seg.enabled == '\0') {
      memset(dst,0,0xac);
    }
    else if (((cpi->common).seg.update_data == '\0') &&
            (pRVar6 = (cpi->common).prev_frame, pRVar6 != (RefCntBuffer *)0x0)) {
      segfeatures_copy(dst,&pRVar6->seg);
      (cpi->common).seg.enabled = (((cpi->common).prev_frame)->seg).enabled;
    }
    else {
      av1_calculate_segdata(dst);
    }
    segfeatures_copy(&((cpi->common).cur_frame)->seg,dst);
    (((cpi->common).cur_frame)->seg).enabled = (cpi->common).seg.enabled;
    psnr_00 = psnr;
    lVar12 = 0;
    do {
      if (lVar12 == 0) {
        (cpi->common).features.allow_intrabc = false;
        _Var11 = false;
        iVar9 = 0;
      }
      else {
        _Var11 = true;
        iVar9 = 1;
        if (lVar12 == 2) {
          (cpi->sf).part_sf.partition_search_type = PVar3;
          (cpi->sf).part_sf.fixed_partition_size = BVar4;
          if ((cpi->common).features.allow_screen_content_tools != false) {
            return;
          }
          aom_free((cpi->token_info).tile_tok[0][0]);
          (cpi->token_info).tile_tok[0][0] = (TokenExtra *)0x0;
          aom_free((cpi->token_info).tplist[0][0]);
          (cpi->token_info).tplist[0][0] = (TokenList *)0x0;
          (cpi->token_info).tokens_allocated = 0;
          return;
        }
      }
      (cpi->common).features.allow_screen_content_tools = _Var11;
      cpi->use_screen_content_tools = iVar9;
      (cpi->sf).part_sf.partition_search_type = '\x01';
      (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
      av1_set_quantizer(cm,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,q,
                        (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                        (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                        (cpi->oxcf).tune_cfg.tuning);
      av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
      av1_init_quantizer(&cpi->enc_quant_dequant_params,&(cpi->common).quant_params,
                         ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
      av1_set_variance_partition_thresholds(cpi,q,0);
      av1_encode_frame(cpi);
      aom_calc_highbd_psnr
                (cpi->source,&((cpi->common).cur_frame)->buf,psnr_00,(cpi->td).mb.e_mbd.bd,
                 (cpi->oxcf).input_cfg.input_bit_depth);
      if (lVar12 == 1) {
        if ((0.9 < psnr[1].psnr[0] - psnr[0].psnr[0]) ||
           (dVar13 = (double)cpi->palette_pixel_num /
                     (double)((cpi->common).width * (cpi->common).height), iVar7 = 0, _Var11 = _Var1
           , iVar9 = iVar5, uVar10 = (uint)_Var2,
           0.0001 <= dVar13 && 4.0 < (psnr[1].psnr[0] - psnr[0].psnr[0]) / dVar13)) {
          uVar10 = cpi->intrabc_used;
          _Var11 = true;
          iVar9 = 1;
          iVar7 = 1;
        }
        (cpi->common).features.allow_screen_content_tools = _Var11;
        (cpi->common).features.allow_intrabc = uVar10 != 0;
        cpi->use_screen_content_tools = iVar7;
        cpi->is_screen_content_type = iVar9;
      }
      lVar12 = lVar12 + 1;
      psnr_00 = psnr_00 + 1;
    } while( true );
  }
  return;
}

Assistant:

void av1_determine_sc_tools_with_encoding(AV1_COMP *cpi, const int q_orig) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const QuantizationCfg *const q_cfg = &oxcf->q_cfg;
  // Variables to help determine if we should allow screen content tools.
  int projected_size_pass[3] = { 0 };
  PSNR_STATS psnr[3];
  const int is_key_frame = cm->current_frame.frame_type == KEY_FRAME;
  const int allow_screen_content_tools_orig_decision =
      cm->features.allow_screen_content_tools;
  const int allow_intrabc_orig_decision = cm->features.allow_intrabc;
  const int use_screen_content_tools_orig_decision =
      cpi->use_screen_content_tools;
  const int is_screen_content_type_orig_decision = cpi->is_screen_content_type;
  // Turn off the encoding trial for forward key frame and superres.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode || oxcf->kf_cfg.fwd_kf_enabled ||
      cpi->superres_mode != AOM_SUPERRES_NONE || oxcf->mode == REALTIME ||
      use_screen_content_tools_orig_decision || !is_key_frame) {
    return;
  }

  // TODO(chengchen): multiple encoding for the lossless mode is time consuming.
  // Find a better way to determine whether screen content tools should be used
  // for lossless coding.
  // Use a high q and a fixed partition to do quick encoding.
  const int q_for_screen_content_quick_run =
      is_lossless_requested(&oxcf->rc_cfg) ? q_orig : AOMMAX(q_orig, 244);
  const int partition_search_type_orig = cpi->sf.part_sf.partition_search_type;
  const BLOCK_SIZE fixed_partition_block_size_orig =
      cpi->sf.part_sf.fixed_partition_size;

  // Setup necessary params for encoding, including frame source, etc.

  cpi->source = av1_realloc_and_scale_if_required(
      cm, cpi->unscaled_source, &cpi->scaled_source, cm->features.interp_filter,
      0, false, false, cpi->oxcf.border_in_pixels, cpi->alloc_pyramid);
  if (cpi->unscaled_last_source != NULL) {
    cpi->last_source = av1_realloc_and_scale_if_required(
        cm, cpi->unscaled_last_source, &cpi->scaled_last_source,
        cm->features.interp_filter, 0, false, false, cpi->oxcf.border_in_pixels,
        cpi->alloc_pyramid);
  }

  av1_setup_frame(cpi);

  if (cm->seg.enabled) {
    if (!cm->seg.update_data && cm->prev_frame) {
      segfeatures_copy(&cm->seg, &cm->prev_frame->seg);
      cm->seg.enabled = cm->prev_frame->seg.enabled;
    } else {
      av1_calculate_segdata(&cm->seg);
    }
  } else {
    memset(&cm->seg, 0, sizeof(cm->seg));
  }
  segfeatures_copy(&cm->cur_frame->seg, &cm->seg);
  cm->cur_frame->seg.enabled = cm->seg.enabled;

  // The two encoding passes aim to help determine whether to use screen
  // content tools, with a high q and fixed partition.
  for (int pass = 0; pass < 2; ++pass) {
    set_encoding_params_for_screen_content(cpi, pass);
    av1_set_quantizer(cm, q_cfg->qm_minlevel, q_cfg->qm_maxlevel,
                      q_for_screen_content_quick_run,
                      q_cfg->enable_chroma_deltaq, q_cfg->enable_hdr_deltaq,
                      oxcf->mode == ALLINTRA, oxcf->tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi, oxcf->speed);

    av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                       cm->seq_params->bit_depth, oxcf->algo_cfg.sharpness);

    av1_set_variance_partition_thresholds(cpi, q_for_screen_content_quick_run,
                                          0);
    // transform / motion compensation build reconstruction frame
    av1_encode_frame(cpi);
    // Screen content decision
    screen_content_tools_determination(
        cpi, allow_screen_content_tools_orig_decision,
        allow_intrabc_orig_decision, use_screen_content_tools_orig_decision,
        is_screen_content_type_orig_decision, pass, projected_size_pass, psnr);
  }

  // Set partition speed feature back.
  cpi->sf.part_sf.partition_search_type = partition_search_type_orig;
  cpi->sf.part_sf.fixed_partition_size = fixed_partition_block_size_orig;

  // Free token related info if screen content coding tools are not enabled.
  if (!cm->features.allow_screen_content_tools)
    free_token_info(&cpi->token_info);
}